

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::applyMerge(PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
             *this,size_t partitionIdA,size_t partitionIdB)

{
  PartitionGraph *this_00;
  pointer puVar1;
  _Hash_node_base *p_Var2;
  Data *pDVar3;
  _Hash_node_base *p_Var4;
  pointer pRVar5;
  _Hash_node_base *p_Var6;
  pointer pAVar7;
  ulong uVar8;
  _Hash_node_base *p_Var9;
  bool bVar10;
  pointer puVar11;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *pPVar12;
  _Hash_node_base *p_Var13;
  _Hash_node_base *p_Var14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  difference_type __d;
  ulong uVar15;
  _Hash_node_base *p_Var16;
  pointer pAVar17;
  value_type *__range2;
  size_t partitionId;
  unsigned_long *v;
  pointer puVar18;
  double dVar19;
  double extraout_XMM0_Qa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  value_type *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
  *local_48;
  pointer local_40;
  size_t local_38;
  
  puVar1 = (this->partitionGraph_).partitions_.
           super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar1[partitionIdA]._M_h._M_element_count != 0) &&
     (local_40 = puVar1 + partitionIdB, (local_40->_M_h)._M_element_count != 0)) {
    p_Var13 = puVar1[partitionIdA]._M_h._M_before_begin._M_nxt;
    if (p_Var13 == (_Hash_node_base *)0x0) {
      dVar19 = 0.0;
    }
    else {
      p_Var2 = (local_40->_M_h)._M_before_begin._M_nxt;
      pDVar3 = (this->super_HeuristicBase).data_;
      dVar19 = 0.0;
      do {
        if (p_Var2 != (_Hash_node_base *)0x0) {
          p_Var4 = p_Var13[1]._M_nxt;
          pRVar5 = (pDVar3->problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          p_Var16 = p_Var2;
          do {
            p_Var6 = p_Var16[1]._M_nxt;
            p_Var14 = p_Var6;
            p_Var9 = p_Var4;
            if ((ulong)((long)pRVar5[(long)p_Var4].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pRVar5[(long)p_Var4].vector_) <=
                (ulong)((long)pRVar5[(long)p_Var6].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pRVar5[(long)p_Var6].vector_)) {
              p_Var14 = p_Var4;
              p_Var9 = p_Var6;
            }
            pAVar17 = *(pointer *)&pRVar5[(long)p_Var14].vector_;
            pAVar7 = pRVar5[(long)p_Var14].vector_.
                     super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar15 = (long)pAVar7 - (long)pAVar17 >> 4;
            while (uVar8 = uVar15, 0 < (long)uVar8) {
              uVar15 = uVar8 >> 1;
              if (*(_Hash_node_base **)(pAVar17 + uVar15) < p_Var9) {
                pAVar17 = pAVar17 + uVar15 + 1;
                uVar15 = ~uVar15 + uVar8;
              }
            }
            if ((pAVar7 == pAVar17) || ((_Hash_node_base *)pAVar17->vertex_ != p_Var9)) {
              bVar10 = false;
              uVar15 = 0;
            }
            else {
              uVar15 = pAVar17->edge_;
              bVar10 = true;
            }
            if (bVar10) {
              dVar19 = dVar19 - (pDVar3->costs).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar15];
            }
            p_Var16 = p_Var16->_M_nxt;
          } while (p_Var16 != (_Hash_node_base *)0x0);
        }
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    this->internalObjective_ = dVar19 + this->internalObjective_;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (size_t *)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    uVar15 = puVar1[partitionIdA]._M_h._M_element_count;
    uVar8 = (local_40->_M_h)._M_element_count;
    local_48 = this;
    local_38 = partitionIdA;
    if (uVar15 < uVar8) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,uVar15);
      for (p_Var13 = puVar1[partitionIdA]._M_h._M_before_begin._M_nxt; partitionId = partitionIdB,
          p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
        if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(p_Var13 + 1));
        }
        else {
          *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)p_Var13[1]._M_nxt;
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,uVar8);
      partitionId = local_38;
      for (p_Var13 = (local_40->_M_h)._M_before_begin._M_nxt; local_38 = partitionId,
          p_Var13 != (_Hash_node_base *)0x0; p_Var13 = p_Var13->_M_nxt) {
        if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(p_Var13 + 1));
        }
        else {
          *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)p_Var13[1]._M_nxt;
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        partitionId = local_38;
      }
    }
    puVar11 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this_00 = &local_48->partitionGraph_;
    for (puVar18 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar18 != puVar11;
        puVar18 = puVar18 + 1) {
      PartitionGraph::forceMove(this_00,*puVar18,partitionId);
    }
    PartitionGraph::updateEdgesOfPartition(this_00,local_38);
    PartitionGraph::updateEdgesOfPartition(this_00,partitionIdB);
    if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (size_t *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pPVar12 = local_48;
    (*(local_48->super_HeuristicBase)._vptr_HeuristicBase[3])(local_48,partitionId,partitionId);
    pPVar12->branchingObjective_ =
         (extraout_XMM0_Qa - pPVar12->localBranchingObjective_) + pPVar12->branchingObjective_;
  }
  return;
}

Assistant:

inline void
PartitionOptimizerBase<BROPT>::applyMerge(size_t partitionIdA,
                                          size_t partitionIdB)
{
    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    if (partitionA.empty() || partitionB.empty()) {
        return;
    }

    // calculate gain (in-frame) of merging.
    Cost dObj = .0;
    for (const auto& v : partitionA) {
        for (const auto& w : partitionB) {
            const auto p = this->data_.problemGraph.graph().findEdge(v, w);
            if (p.first) {
                dObj -= this->data_.costs[p.second];
            }
        }
    }
    internalObjective_ += dObj;

    // merge & update partitionGraph
    size_t otherId;
    {
        std::vector<size_t> buffer;
        if (partitionA.size() < partitionB.size()) {
            otherId = partitionIdB;

            buffer.reserve(partitionA.size());
            for (const auto& v : partitionA) {
                buffer.emplace_back(v);
            }
        } else {
            otherId = partitionIdA;

            buffer.reserve(partitionB.size());
            for (const auto& v : partitionB) {
                buffer.emplace_back(v);
            }
        }

        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, otherId);
        }

        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);
    }

    // calculate new branching.
    const auto localBranchingObj = solveLocalBranchingProblem(otherId, otherId);
    const auto dLocalBranchingObj =
        (localBranchingObj - localBranchingObjective_);

    branchingObjective_ += dLocalBranchingObj;
}